

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O0

void chaiscript::bootstrap::
     copy_constructor<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>>
               (string *type,Module *m)

{
  string local_48;
  Proxy_Function local_28;
  Module *local_18;
  Module *m_local;
  string *type_local;
  
  local_18 = m;
  m_local = (Module *)type;
  constructor<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>(std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>const&)>
            ();
  std::__cxx11::string::string
            ((string *)&local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)m_local);
  Module::add(m,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_28);
  return;
}

Assistant:

void copy_constructor(const std::string &type, Module &m) {
    m.add(constructor<T(const T &)>(), type);
  }